

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O3

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf
          (CycleBreaking<covenant::Sym> *this,CFG *g,vector<int,_std::allocator<int>_> *group,
          set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  int iVar1;
  pointer pvVar2;
  pointer pPVar3;
  bool bVar4;
  Sym LHS;
  pointer piVar5;
  pointer piVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> pi;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> r;
  unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
  new_non_terminals;
  Rule local_140;
  ulong local_118;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_110;
  element_type *local_f8;
  shared_count local_f0;
  CycleBreaking<covenant::Sym> *local_e8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_e0;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  local_d8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_a8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  local_60;
  
  piVar5 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((long)piVar6 - (long)piVar5 != 4) {
    local_d8.super_functions<boost::hash<int>,_std::equal_to<int>_>.current_ = '\0';
    uVar8 = 0x26;
    puVar7 = boost::unordered::detail::prime_list_template<unsigned_long>::value;
    do {
      uVar10 = uVar8 >> 1;
      uVar11 = ~uVar10 + uVar8;
      uVar8 = uVar10;
      if (*(ulong *)((long)puVar7 + uVar10 * 8) < 0xb) {
        puVar7 = (undefined1 *)((ulong *)((long)puVar7 + uVar10 * 8) + 1);
        uVar8 = uVar11;
      }
    } while (0 < (long)uVar8);
    puVar9 = (ulong *)(boost::unordered::detail::prime_list_template<unsigned_long>::value + 0x128);
    if (puVar7 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
      puVar9 = (ulong *)puVar7;
    }
    local_d8.bucket_count_ = *puVar9;
    local_d8.size_ = 0;
    local_d8.mlf_ = 1.0;
    local_d8.max_load_ = 0;
    local_d8.buckets_ = (bucket_pointer)0x0;
    local_e8 = this;
    local_e0 = &group_set->_M_t;
    if (piVar6 != piVar5) {
      uVar8 = 0;
      uVar10 = 1;
      do {
        LHS = CFG::newVar(g);
        local_140._tfac.px = (g->_tfac).px;
        local_f0.pi_ = (g->_tfac).pn.pi_;
        if ((element_type *)local_f0.pi_ == (element_type *)0x0) {
          local_110.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_00152f45:
          local_140._tfac.pn.pi_ = (sp_counted_base *)0x0;
        }
        else {
          LOCK();
          *(uint_least32_t *)&(((element_type *)local_f0.pi_)->_bimap).px =
               *(uint_least32_t *)&(((element_type *)local_f0.pi_)->_bimap).px + 1;
          UNLOCK();
          local_110.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_f0.pi_;
          if ((element_type *)local_f0.pi_ == (element_type *)0x0) goto LAB_00152f45;
          LOCK();
          *(uint_least32_t *)&(((element_type *)local_f0.pi_)->_bimap).px =
               *(uint_least32_t *)&(((element_type *)local_f0.pi_)->_bimap).px + 1;
          UNLOCK();
          LOCK();
          *(uint_least32_t *)&(((element_type *)local_f0.pi_)->_bimap).px =
               *(uint_least32_t *)&(((element_type *)local_f0.pi_)->_bimap).px + 1;
          UNLOCK();
          local_140._tfac.pn.pi_ = local_f0.pi_;
        }
        local_140._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_140._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_140._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_110.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_140._tfac.px;
        local_f8 = local_140._tfac.px;
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_110.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        CFG::prod(g,LHS,&local_140);
        if (local_140._syms.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_140._syms.
                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        boost::detail::shared_count::~shared_count(&local_140._tfac.pn);
        boost::detail::shared_count::~shared_count(&local_f0);
        local_140._tfac.px =
             (element_type *)
             CONCAT44(LHS.x,(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar8]);
        boost::unordered::detail::
        table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
        ::emplace_unique<std::pair<int,covenant::Sym>>
                  ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                    *)&local_d8,(const_key_type *)&local_140,(pair<int,_covenant::Sym> *)&local_140)
        ;
        piVar5 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar4 = uVar10 < (ulong)((long)piVar6 - (long)piVar5 >> 2);
        uVar8 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar4);
    }
    if (piVar6 != piVar5) {
      uVar8 = 0;
      do {
        std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::vector
                  ((vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_> *)
                   &local_140,
                   (g->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + piVar5[uVar8]);
        iVar1 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar8];
        pvVar2 = (g->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar3 = pvVar2[iVar1].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar2[iVar1].
                     super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                     ._M_impl.super__Vector_impl_data + 8) != pPVar3) {
          *(pointer *)
           ((long)&pvVar2[iVar1].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data + 8) = pPVar3;
        }
        local_118 = uVar8;
        if ((element_type *)local_140._tfac.pn.pi_ != local_140._tfac.px) {
          uVar8 = 0;
          uVar10 = 1;
          do {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_110,
                       (g->rules).
                       super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *(int *)((long)&(local_140._tfac.px)->_next_id + uVar8 * 4));
            iVar1 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[local_118];
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector(&local_a8,&local_110)
            ;
            boost::unordered::
            unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
            ::unordered_map((unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                             *)&local_60,
                            (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                             *)&local_d8);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree(&local_90,local_e0);
            cycle_breaking_transf_rule
                      (local_e8,g,iVar1,&local_a8,
                       (unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
                        *)&local_60,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_90);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_90);
            boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
            ::~table(&local_60);
            if (local_a8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((element_type *)
                local_110.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start != (element_type *)0x0) {
              operator_delete(local_110.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            bVar4 = uVar10 < (ulong)((long)local_140._tfac.pn.pi_ - (long)local_140._tfac.px >> 2);
            uVar8 = uVar10;
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (bVar4);
        }
        if (local_140._tfac.px != (element_type *)0x0) {
          operator_delete(local_140._tfac.px);
        }
        uVar8 = (ulong)((int)local_118 + 1);
        piVar5 = (group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar8 < (ulong)((long)(group->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
    }
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
    ::~table(&local_d8);
  }
  return;
}

Assistant:

void  cycle_breaking_transf (CFG &g, 
                               const vector<int> &group, 
                               const set<int> &group_set)
  {
    if (group.size() == 1) return;

    boost::unordered_map<int, EdgeSym> new_non_terminals;
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      // add epsilon productions
      EdgeSym A( g.newVar () );
      g.prod(A, Rule::E (g.getTermFactory ()));
      new_non_terminals.insert(make_pair(group[nt], A));
      // LOG ("abstraction" , 
      //      cout << "Added " << A << " -> e " <<  " from " 
      //           << EdgeSym::mkVar(group[nt]) << "\n");
           
    }
    // iterate over each nonterminal in the mutually recursive group 
    for (unsigned nt=0; nt<group.size(); nt++)
    {
      vector<CFG::ProdInfo> pi(g.prods[group[nt]]);
      g.prods[group[nt]].clear();
      // iterate over each rule in the production

      // LOG ("abstraction", 
      //      cout << "Production: "; g.printProduction(cout, group[nt]); cout << endl);

      for( unsigned int ri = 0; ri < pi.size(); ri++ )
      {
        vector<EdgeSym> r(g.rules[pi[ri].rule]);

        // LOG("abstraction", 
        //     cout << "\tRule: "; Rule(r, g.getTermFactory ()); cout << endl);

        cycle_breaking_transf_rule(g, 
                                   group[nt], 
                                   r, 
                                   new_non_terminals, 
                                   group_set);
      }
    }
  }